

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.h
# Opt level: O2

uchar __thiscall CVmObjByteArray::get_element(CVmObjByteArray *this,unsigned_long idx)

{
  uint uVar1;
  
  uVar1 = (uint)(idx - 1);
  return *(uchar *)(*(long *)(*(long *)((this->super_CVmObject).ext_ + (idx - 1 >> 0x1c) * 8 + 4) +
                             (ulong)(uVar1 >> 0xc & 0xfff8)) + (ulong)(uVar1 & 0x7fff));
}

Assistant:

unsigned char *get_ele_ptr(unsigned long idx, size_t *bytes_avail) const
    {
        size_t s1;
        size_t s2;
        size_t s3;

        /* convert to a zero-based index */
        --idx;
        
        /* 
         *   calculate the page table index - since each page holds 32k
         *   bytes and each page table points to 8k pages, divide by 32k*8k
         *   == 2^15*2^13 == 2^28 
         */
        s1 = idx >> 28;

        /* 
         *   calculate the page index within the page table - each page
         *   holds 32k, so calculate the excess from the page table selector
         *   (i.e, idx % 32k*8k) and then divide by 32k == 2^15 
         */
        s2 = (idx & 0x0FFFFFFF) >> 15;

        /* 
         *   calculate the page offset - this is simply the excess from the
         *   page index 
         */
        s3 = idx & 0x7FFF;

        /*
         *   Each page holds 32k, so the number of contiguous bytes starting
         *   at this byte is 32k less the index.  
         */
        *bytes_avail = (32*1024) - s3;

        /* 
         *   dereference the extension to get the page table, deference the
         *   page table to get the page, and index the page by the offset 
         */
        return get_page_table_ptr(s1)[s2] + s3;
    }